

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O3

int __thiscall
ary::TemplatePlaneVerifier::verify
          (TemplatePlaneVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Mat *image;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _OutputArray *p_Var6;
  undefined8 uVar7;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  TemplatePlaneVerifier *this_00;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> mask_points;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> template_points;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> bounds_points;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> model_points;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points;
  Mat homography;
  Mat verification;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_238;
  void *local_218;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *pvStack_210;
  Size local_208;
  _InputArray local_200;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  void *local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  double local_1b0;
  CameraModel *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  CameraModel *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  void *local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  _InputArray local_170;
  _InputArray local_158;
  _OutputArray local_140;
  _InputArray local_128;
  Mat local_110;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  uchar *local_98;
  Scalar local_48;
  
  local_1d8._8_8_ = local_1d8._0_8_;
  local_1c8 = (void *)0x0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  local_110.flags = 0;
  local_110.dims = 0;
  local_110.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&local_1c8,
             (Point3_<float> *)&local_110);
  local_110.flags = (int)(float)(this->model_size).width;
  local_110.dims = 0;
  local_110.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&local_1c8,
             (Point3_<float> *)&local_110);
  local_110.flags = (int)(float)(this->model_size).width;
  local_110.dims = (int)(float)(this->model_size).height;
  local_110.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&local_1c8,
             (Point3_<float> *)&local_110);
  local_110.dims = (int)(float)(this->model_size).height;
  local_110.flags = 0;
  local_110.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&local_1c8,
             (Point3_<float> *)&local_110);
  local_178 = 0;
  local_188 = (void *)0x0;
  uStack_180 = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_1d8._8_8_;
  local_1d8 = auVar5 << 0x40;
  local_1e8._0_4_ = 0x81030015;
  local_1e8._8_8_ = (vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&local_1c8;
  (**(code **)(**(long **)sig + 0x10))(&local_238);
  local_218 = (void *)CONCAT44(local_218._4_4_,-0x3efdfffb);
  local_208.width = 1;
  local_208.height = 3;
  pvStack_210 = &local_238;
  (**(code **)(**(long **)sig + 0x10))(&local_158);
  local_200.obj = (void *)((long)&local_158.obj + 4);
  local_200.flags = -0x3efdfffb;
  local_200.sz.width = 1;
  local_200.sz.height = 3;
  CameraUser::getCameraModel((CameraUser *)this);
  CameraModel::getIntrinsics(local_198);
  local_170.flags = -0x3efdfffb;
  local_170.sz.width = 3;
  local_170.sz.height = 3;
  local_170.obj = local_a8;
  CameraUser::getCameraModel((CameraUser *)this);
  CameraModel::getDistortion(&local_110,local_1a8);
  local_128.sz.width = 0;
  local_128.sz.height = 0;
  local_128.flags = 0x1010000;
  local_140.super__InputArray.sz.width = 0;
  local_140.super__InputArray.sz.height = 0;
  local_140.super__InputArray.flags = -0x7dfcfff3;
  local_140.super__InputArray.obj = &local_188;
  local_128.obj = &local_110;
  p_Var6 = (_OutputArray *)cv::noArray();
  cv::projectPoints((_InputArray *)local_1e8,(_InputArray *)&local_218,&local_200,&local_170,
                    &local_128,&local_140,p_Var6,0.0);
  cv::Mat::~Mat(&local_110);
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
  }
  if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190);
  }
  local_208.width = 0;
  local_208.height = 0;
  local_218 = (void *)0x0;
  pvStack_210 = (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)0x0;
  local_110.flags = 0;
  local_110.dims = 0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_218,
             (Point_<float> *)&local_110);
  local_110.flags = (int)(float)(this->model_template).cols;
  local_110.dims = 0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_218,
             (Point_<float> *)&local_110);
  uVar1 = (this->model_template).rows;
  uVar2 = (this->model_template).cols;
  local_110.dims = (int)(float)(int)uVar1;
  local_110.flags = (int)(float)(int)uVar2;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_218,
             (Point_<float> *)&local_110);
  local_110.dims = (int)(float)(this->model_template).rows;
  local_110.flags = 0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_218,
             (Point_<float> *)&local_110);
  local_98 = (uchar *)0x0;
  local_a8._0_4_ = -0x7efcfff3;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_1d8._8_8_;
  local_1d8 = auVar3 << 0x40;
  local_1e8._0_4_ = 0x8103000d;
  local_1e8._8_8_ = (vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_218;
  local_a8._8_8_ = &local_188;
  cv::getPerspectiveTransform((_InputArray *)&local_110,(_InputArray *)local_a8,(int)local_1e8);
  cv::Mat::Mat((Mat *)local_a8);
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_238.
                         super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,2.3693558e-38);
  local_200.sz.width = 0;
  local_200.sz.height = 0;
  local_200.flags = 0x2010000;
  local_158.sz.width = 0;
  local_158.sz.height = 0;
  local_158.flags = 0x1010000;
  uVar7 = *(undefined8 *)(this->model_template).size.p;
  local_b0 = CONCAT44((int)uVar7,(int)((ulong)uVar7 >> 0x20));
  local_1d8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)ctx;
  local_200.obj = (Mat *)local_a8;
  local_158.obj = &local_110;
  cv::warpPerspective();
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_1d8._8_8_;
  local_1d8 = auVar4 << 0x40;
  local_1e8 = (undefined1  [16])0x0;
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)local_1e8,
             (Point_<float> *)&local_238);
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(ulong)(uint)(float)*(int *)(ctx + 0xc);
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)local_1e8,
             (Point_<float> *)&local_238);
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = (float)(int)*(undefined8 *)(ctx + 8);
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = (float)(int)((ulong)*(undefined8 *)(ctx + 8) >> 0x20);
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)local_1e8,
             (Point_<float> *)&local_238);
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)((ulong)(uint)(float)*(int *)(ctx + 8) << 0x20);
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)local_1e8,
             (Point_<float> *)&local_238);
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_200.sz.width = 0;
  local_200.sz.height = 0;
  local_200.flags = -0x7efcfff3;
  local_158.sz.width = 0;
  local_158.sz.height = 0;
  local_158.flags = -0x7dfcfff3;
  local_170.sz.width = 0;
  local_170.sz.height = 0;
  local_170.flags = 0x1010000;
  local_200.obj = (vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)local_1e8;
  local_170.obj = &local_110;
  local_158.obj = (Point_<float> *)&local_238;
  cv::perspectiveTransform(&local_200,(_OutputArray *)&local_158,&local_170);
  local_158.flags = 0;
  local_158._4_4_ = 0;
  local_200.flags = -0x3efdfffa;
  local_200.sz.width = 1;
  local_200.sz.height = 1;
  local_200.obj = &local_158;
  cv::noArray();
  image = &this->model_mask;
  cv::Mat::setTo((_InputArray *)image,&local_200);
  local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
  local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
  local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
  this_00 = (TemplatePlaneVerifier *)image;
  fillPolygon(image,&local_238,&local_48);
  local_1b0 = match_template(this_00,&this->model_template,(Mat *)local_a8,image);
  if ((Point_<float>)
      local_238.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (Point_<float>)0x0) {
    operator_delete(local_238.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_1e8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_1e8._0_8_);
  }
  cv::Mat::~Mat((Mat *)local_a8);
  uVar7 = cv::Mat::~Mat(&local_110);
  if (local_218 != (void *)0x0) {
    operator_delete(local_218);
    uVar7 = extraout_RAX;
  }
  if (local_188 != (void *)0x0) {
    operator_delete(local_188);
    uVar7 = extraout_RAX_00;
  }
  if (local_1c8 != (void *)0x0) {
    operator_delete(local_1c8);
    uVar7 = extraout_RAX_01;
  }
  return (int)CONCAT71((int7)((ulong)uVar7 >> 8),0.4 < local_1b0);
}

Assistant:

bool TemplatePlaneVerifier::verify(const Mat& image, const SharedPlanarLocalization& localization) {

	vector<Point3f> model_points;
	model_points.push_back(Point3f(0, 0, 0));
	model_points.push_back(Point3f(model_size.width, 0, 0));
	model_points.push_back(Point3f(model_size.width, model_size.height, 0));
	model_points.push_back(Point3f(0, model_size.height, 0));

	vector<Point2f> image_points;
	projectPoints(model_points, localization->getCameraPosition().rotation, localization->getCameraPosition().translation, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion(), image_points);

	vector<Point2f> template_points;
	template_points.push_back(Point2f(0, 0));
	template_points.push_back(Point2f(model_template.cols, 0));
	template_points.push_back(Point2f(model_template.cols, model_template.rows));
	template_points.push_back(Point2f(0, model_template.rows));

	Mat homography = getPerspectiveTransform(image_points, template_points);

	Mat verification;
	cv::warpPerspective(image, verification, homography, model_template.size());

	vector<Point2f> bounds_points;
	bounds_points.push_back(Point2f(0, 0));
	bounds_points.push_back(Point2f(image.cols, 0));
	bounds_points.push_back(Point2f(image.cols, image.rows));
	bounds_points.push_back(Point2f(0, image.rows));
	vector<Point2f> mask_points;

	perspectiveTransform(bounds_points, mask_points, homography);

	model_mask.setTo(0);

	fillPolygon(model_mask, mask_points, Scalar(255));

	double match_score = match_template(model_template, verification, model_mask);

	return (match_score > 0.4);

}